

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall
slang::ast::TypePrinter::visit
          (TypePrinter *this,FixedSizeUnpackedArrayType *type,string_view param_2)

{
  int iVar1;
  FormatBuffer *this_00;
  format_string<unsigned_int> fmt;
  format_string<const_int_&,_const_int_&> fmt_00;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  if ((this->options).anonymousTypeStyle == FriendlyName) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"unpacked array ",
               "");
    iVar1 = (type->range).right;
    this_00 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    if (iVar1 < 1 || (type->range).left != 0) {
      fmt_00.str.size_ = 7;
      fmt_00.str.data_ = "[{}:{}]";
      FormatBuffer::format<int_const&,int_const&>
                (this_00,fmt_00,&(type->range).left,&(type->range).right);
    }
    else {
      local_20._M_len = CONCAT44(local_20._M_len._4_4_,iVar1 + 1);
      fmt.str.size_ = 4;
      fmt.str.data_ = "[{}]";
      FormatBuffer::format<unsigned_int>(this_00,fmt,(uint *)&local_20);
    }
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl," of ","");
    local_20._M_len = 0;
    local_20._M_str = "";
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (&type->elementType->super_Symbol,this,&local_20);
    return;
  }
  printUnpackedArray(this,&type->super_Type);
  return;
}

Assistant:

void TypePrinter::visit(const FixedSizeUnpackedArrayType& type, std::string_view) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        buffer->append("unpacked array ");
        if (!type.range.isLittleEndian() && type.range.lower() == 0)
            buffer->format("[{}]", type.range.width());
        else
            buffer->format("[{}:{}]", type.range.left, type.range.right);

        buffer->append(" of ");
        type.elementType.visit(*this, ""sv);
    }
    else {
        printUnpackedArray(type);
    }
}